

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

CameraHandle __thiscall
pbrt::CameraHandle::Create
          (CameraHandle *this,string *name,ParameterDictionary *parameters,MediumHandle *medium,
          CameraTransform *cameraTransform,FilmHandle *film,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  PerspectiveCamera *pPVar2;
  ulong uVar3;
  char *fmt;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_70;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_68;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_60;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_58;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_50;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_48;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_40;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_38;
  
  (this->
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  ).bits = 0;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    local_38.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
    local_40.bits =
         (medium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar2 = PerspectiveCamera::Create
                       (parameters,cameraTransform,(FilmHandle *)&local_38,(MediumHandle *)&local_40
                        ,loc,alloc);
    uVar3 = 0x1000000000000;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      local_48.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
      local_50.bits =
           (medium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pPVar2 = (PerspectiveCamera *)
               OrthographicCamera::Create
                         (parameters,cameraTransform,(FilmHandle *)&local_48,
                          (MediumHandle *)&local_50,loc,alloc);
      uVar3 = 0x2000000000000;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        local_58.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
        local_60.bits =
             (medium->
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             ).bits;
        pPVar2 = (PerspectiveCamera *)
                 RealisticCamera::Create
                           (parameters,cameraTransform,(FilmHandle *)&local_58,
                            (MediumHandle *)&local_60,loc,alloc);
        uVar3 = 0x4000000000000;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          fmt = "%s: camera type unknown.";
          goto LAB_003536d4;
        }
        local_68.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
        local_70.bits =
             (medium->
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             ).bits;
        pPVar2 = (PerspectiveCamera *)
                 SphericalCamera::Create
                           (parameters,cameraTransform,(FilmHandle *)&local_68,
                            (MediumHandle *)&local_70,loc,alloc);
        uVar3 = 0x3000000000000;
      }
    }
  }
  (this->
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  ).bits = uVar3 | (ulong)pPVar2;
  if (((ulong)pPVar2 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (CameraHandle)
           (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            )this;
  }
  fmt = "%s: unable to create camera.";
LAB_003536d4:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

CameraHandle CameraHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  MediumHandle medium,
                                  const CameraTransform &cameraTransform, FilmHandle film,
                                  const FileLoc *loc, Allocator alloc) {
    CameraHandle camera;
    if (name == "perspective")
        camera = PerspectiveCamera::Create(parameters, cameraTransform, film, medium, loc,
                                           alloc);
    else if (name == "orthographic")
        camera = OrthographicCamera::Create(parameters, cameraTransform, film, medium,
                                            loc, alloc);
    else if (name == "realistic")
        camera = RealisticCamera::Create(parameters, cameraTransform, film, medium, loc,
                                         alloc);
    else if (name == "spherical")
        camera = SphericalCamera::Create(parameters, cameraTransform, film, medium, loc,
                                         alloc);
    else
        ErrorExit(loc, "%s: camera type unknown.", name);

    if (!camera)
        ErrorExit(loc, "%s: unable to create camera.", name);

    parameters.ReportUnused();
    return camera;
}